

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PECommander.h
# Opt level: O1

void __thiscall
PrintStringsCommand::execute(PrintStringsCommand *this,CmdParams *params,CmdContext *context)

{
  PEFile *pe;
  ResourcesContainer *this_00;
  size_t sVar1;
  ostream *poVar2;
  string local_38;
  
  pe = cmd_util::getPEFromContext(context);
  if (pe != (PEFile *)0x0) {
    if (pe->album == (ResourcesAlbum *)0x0) {
      this_00 = (ResourcesContainer *)0x0;
    }
    else {
      this_00 = ResourcesAlbum::getResourcesOfType(pe->album,RESTYPE_STRING);
    }
    if (this_00 == (ResourcesContainer *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No such resource type!",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      return;
    }
    sVar1 = ResourcesContainer::entriesCount(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total: ",7);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (sVar1 < 0x65) {
      sVar1 = 0;
    }
    else {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"max","");
      sVar1 = cmd_util::readNumber(&local_38,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    cmd_util::printStrings(pe,sVar1);
  }
  return;
}

Assistant:

virtual void execute(CmdParams *params, CmdContext  *context)
    {
        PEFile *pe = cmd_util::getPEFromContext(context);
        if (!pe) return;

        ResourcesContainer* container = pe->getResourcesOfType(pe::RESTYPE_STRING);
        if (container == NULL) {
            std::cout << "No such resource type!" << std::endl;
            return;
        }
        size_t max = container->entriesCount();
        std::cout << "Total: " << max << std::endl;
        size_t limit = 0;
        if (max > 100) {
            limit = cmd_util::readNumber("max");
        }

       cmd_util::printStrings(pe, limit);
    }